

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void basic_test(service *srv,bool throws)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  runtime_error *prVar4;
  url_mapper m;
  streamable local_400;
  streamable local_3e0;
  int local_3c0 [2];
  ostringstream oss_1;
  streamable local_240;
  int local_220 [2];
  streamable local_218;
  ostringstream ss;
  int local_80 [2];
  streamable local_78;
  application app;
  
  cppcms::application::application(&app,srv);
  cppcms::url_mapper::url_mapper(&m,&app);
  poVar2 = std::operator<<((ostream *)&std::cout,"-- Basic Mapping");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&ss,"foo",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/foo",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"foo",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/foo/{1}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"foo",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/foo/{1}/{2}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"foo",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/foo/{1}/{2}/{3}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"foo",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/foo/{1}/{2}/{3}/{4}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"foo",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/foo/{1}/{2}/{3}/{4}/{5}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"foo",(allocator *)&local_400);
  std::__cxx11::string::string
            ((string *)&oss_1,"/foo/{1}/{2}/{3}/{4}/{5}/{6}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"bar",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/bar/{lang}/{1}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"bar",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"/bar/{2}/{1}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"test1",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"{1}x",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"test2",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"x{1}",(allocator *)&local_3e0);
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  psVar3 = (string *)cppcms::application::mapper();
  std::__cxx11::string::string((string *)&ss,"lang",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&oss_1,"en",(allocator *)&local_3e0);
  cppcms::url_mapper::set_value(psVar3,(string *)&ss);
  std::__cxx11::string::~string((string *)&oss_1);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"test.com",(allocator *)&oss_1);
  cppcms::url_mapper::root((string *)&m);
  std::__cxx11::string::~string((string *)&ss);
  cppcms::url_mapper::root_abi_cxx11_();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                          "test.com");
  std::__cxx11::string::~string((string *)&ss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x160);
    std::operator<<(poVar2," m.root()==\"test.com\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&oss_1);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::url_mapper::map((ostream *)&m,(char *)&ss);
  value((string *)&oss_1,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oss_1,"test.com/foo");
  std::__cxx11::string::~string((string *)&oss_1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x164);
    std::operator<<(poVar2," value(ss) == \"test.com/foo\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_400);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_400.ptr_._0_4_ = 1;
  cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_400);
  cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x134111);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oss_1,"test.com/foo/1");
  std::__cxx11::string::~string((string *)&oss_1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x168);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_400);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3e0.ptr_._0_4_ = 1;
  cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_3e0);
  local_240.ptr_._0_4_ = 2;
  cppcms::filters::streamable::streamable<int>(&local_400,(int *)&local_240);
  cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x134111,(streamable *)&oss_1);
  cppcms::filters::streamable::~streamable(&local_400);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oss_1,"test.com/foo/1/2");
  std::__cxx11::string::~string((string *)&oss_1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x16a);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_400);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240.ptr_._0_4_ = 1;
  cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_240);
  local_218.ptr_._0_4_ = 2;
  cppcms::filters::streamable::streamable<int>(&local_400,(int *)&local_218);
  local_78.ptr_._0_4_ = 3;
  cppcms::filters::streamable::streamable<int>(&local_3e0,(int *)&local_78);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x134111,(streamable *)&oss_1,&local_400);
  cppcms::filters::streamable::~streamable(&local_3e0);
  cppcms::filters::streamable::~streamable(&local_400);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oss_1,"test.com/foo/1/2/3");
  std::__cxx11::string::~string((string *)&oss_1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x16c);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_400);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218.ptr_._0_4_ = 1;
  cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_218);
  local_78.ptr_._0_4_ = 2;
  cppcms::filters::streamable::streamable<int>(&local_400,(int *)&local_78);
  local_3c0[1] = 3;
  cppcms::filters::streamable::streamable<int>(&local_3e0,local_3c0 + 1);
  local_3c0[0] = 4;
  cppcms::filters::streamable::streamable<int>(&local_240,local_3c0);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x134111,(streamable *)&oss_1,&local_400,
             &local_3e0);
  cppcms::filters::streamable::~streamable(&local_240);
  cppcms::filters::streamable::~streamable(&local_3e0);
  cppcms::filters::streamable::~streamable(&local_400);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oss_1,"test.com/foo/1/2/3/4");
  std::__cxx11::string::~string((string *)&oss_1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x16e);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3/4\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_400);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_78.ptr_._0_4_ = 1;
  cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_78);
  local_3c0[1] = 2;
  cppcms::filters::streamable::streamable<int>(&local_400,local_3c0 + 1);
  local_3c0[0] = 3;
  cppcms::filters::streamable::streamable<int>(&local_3e0,local_3c0);
  local_220[1] = 4;
  cppcms::filters::streamable::streamable<int>(&local_240,local_220 + 1);
  local_220[0] = 5;
  cppcms::filters::streamable::streamable<int>(&local_218,local_220);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x134111,(streamable *)&oss_1,&local_400,
             &local_3e0,&local_240);
  cppcms::filters::streamable::~streamable(&local_218);
  cppcms::filters::streamable::~streamable(&local_240);
  cppcms::filters::streamable::~streamable(&local_3e0);
  cppcms::filters::streamable::~streamable(&local_400);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oss_1,"test.com/foo/1/2/3/4/5");
  std::__cxx11::string::~string((string *)&oss_1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x170);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3/4/5\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_400);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3c0[1] = 1;
  cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,local_3c0 + 1);
  local_3c0[0] = 2;
  cppcms::filters::streamable::streamable<int>(&local_400,local_3c0);
  local_220[1] = 3;
  cppcms::filters::streamable::streamable<int>(&local_3e0,local_220 + 1);
  local_220[0] = 4;
  cppcms::filters::streamable::streamable<int>(&local_240,local_220);
  local_80[1] = 5;
  cppcms::filters::streamable::streamable<int>(&local_218,local_80 + 1);
  local_80[0] = 6;
  cppcms::filters::streamable::streamable<int>(&local_78,local_80);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x134111,(streamable *)&oss_1,&local_400,
             &local_3e0,&local_240,&local_218);
  cppcms::filters::streamable::~streamable(&local_78);
  cppcms::filters::streamable::~streamable(&local_218);
  cppcms::filters::streamable::~streamable(&local_240);
  cppcms::filters::streamable::~streamable(&local_3e0);
  cppcms::filters::streamable::~streamable(&local_400);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oss_1,"test.com/foo/1/2/3/4/5/6");
  std::__cxx11::string::~string((string *)&oss_1);
  if (bVar1) {
    local_218.ptr_._0_4_ = 1;
    cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_218);
    cppcms::filters::streamable::streamable(&local_400,"a");
    cppcms::filters::streamable::streamable(&local_3e0,"b");
    local_78.ptr_._0_4_ = 5;
    cppcms::filters::streamable::streamable<int>(&local_240,(int *)&local_78);
    cppcms::url_mapper::map
              ((ostream *)&m,(char *)&ss,(streamable *)0x134111,(streamable *)&oss_1,&local_400,
               &local_3e0);
    cppcms::filters::streamable::~streamable(&local_240);
    cppcms::filters::streamable::~streamable(&local_3e0);
    cppcms::filters::streamable::~streamable(&local_400);
    cppcms::filters::streamable::~streamable((streamable *)&oss_1);
    value((string *)&oss_1,&ss);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss_1,"test.com/foo/1/a/b/5");
    std::__cxx11::string::~string((string *)&oss_1);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
      poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x175);
      std::operator<<(poVar2," value(ss) == \"test.com/foo/1/a/b/5\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_400);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_400.ptr_._0_4_ = 1;
    cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_400);
    cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x133611);
    cppcms::filters::streamable::~streamable((streamable *)&oss_1);
    value((string *)&oss_1,&ss);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss_1,"test.com/bar/en/1");
    std::__cxx11::string::~string((string *)&oss_1);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
      poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x178);
      std::operator<<(poVar2," value(ss) == \"test.com/bar/en/1\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_400);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_3e0.ptr_._0_4_ = 1;
    cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_3e0);
    cppcms::filters::streamable::streamable(&local_400,"ru");
    cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x133611,(streamable *)&oss_1);
    cppcms::filters::streamable::~streamable(&local_400);
    cppcms::filters::streamable::~streamable((streamable *)&oss_1);
    value((string *)&oss_1,&ss);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss_1,"test.com/bar/ru/1");
    std::__cxx11::string::~string((string *)&oss_1);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
      poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x17a);
      std::operator<<(poVar2," value(ss) == \"test.com/bar/ru/1\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_400);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&oss_1,"",(allocator *)&local_400);
    cppcms::url_mapper::root((string *)&m);
    std::__cxx11::string::~string((string *)&oss_1);
    local_400.ptr_._0_4_ = 10;
    cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_400);
    cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)"test1");
    cppcms::filters::streamable::~streamable((streamable *)&oss_1);
    value((string *)&oss_1,&ss);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss_1,"10x");
    std::__cxx11::string::~string((string *)&oss_1);
    if (bVar1) {
      local_400.ptr_._0_4_ = 10;
      cppcms::filters::streamable::streamable<int>((streamable *)&oss_1,(int *)&local_400);
      cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)"test2");
      cppcms::filters::streamable::~streamable((streamable *)&oss_1);
      value((string *)&oss_1,&ss);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &oss_1,"x10");
      std::__cxx11::string::~string((string *)&oss_1);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"-- Testing throwing at invalid params");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::string((string *)&oss_1,"x",(allocator *)&local_3e0);
        std::__cxx11::string::string((string *)&local_400,"a{",(allocator *)&local_240);
        cppcms::url_mapper::assign((string *)&m,(string *)&oss_1);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&oss_1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
        poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x184);
        std::operator<<(poVar2," 0");
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)&local_400);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
      poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x17f);
      std::operator<<(poVar2," value(ss) == \"x10\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_400);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x17d);
    std::operator<<(poVar2," value(ss) == \"10x\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_400);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
  poVar2 = std::operator<<((ostream *)&oss_1,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x172);
  std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3/4/5/6\"");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&local_400);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void basic_test(cppcms::service &srv,bool throws)
{
	cppcms::application app(srv);
	cppcms::url_mapper m(&app);

	std::cout << "-- Basic Mapping" << std::endl;

	m.assign("foo","/foo");
	m.assign("foo","/foo/{1}");
	m.assign("foo","/foo/{1}/{2}");
	m.assign("foo","/foo/{1}/{2}/{3}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}/{5}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}/{5}/{6}");
	m.assign("bar","/bar/{lang}/{1}");
	m.assign("bar","/bar/{2}/{1}");
	m.assign("test1","{1}x");
	m.assign("test2","x{1}");
	app.mapper().set_value("lang","en");
	m.root("test.com");
	TEST(m.root()=="test.com");

	std::ostringstream ss;
	m.map(ss,"foo");
	TEST(value(ss) == "test.com/foo");


	m.map(ss,"foo",1);
	TEST(value(ss) == "test.com/foo/1");
	m.map(ss,"foo",1,2);
	TEST(value(ss) == "test.com/foo/1/2");
	m.map(ss,"foo",1,2,3);
	TEST(value(ss) == "test.com/foo/1/2/3");
	m.map(ss,"foo",1,2,3,4);
	TEST(value(ss) == "test.com/foo/1/2/3/4");
	m.map(ss,"foo",1,2,3,4,5);
	TEST(value(ss) == "test.com/foo/1/2/3/4/5");
	m.map(ss,"foo",1,2,3,4,5,6);
	TEST(value(ss) == "test.com/foo/1/2/3/4/5/6");

	m.map(ss,"foo",1,"a","b",5);
	TEST(value(ss) == "test.com/foo/1/a/b/5");
	
	m.map(ss,"bar",1);
	TEST(value(ss) == "test.com/bar/en/1");
	m.map(ss,"bar",1,"ru");
	TEST(value(ss) == "test.com/bar/ru/1");
	m.root("");
	m.map(ss,"test1",10);
	TEST(value(ss) == "10x");
	m.map(ss,"test2",10);
	TEST(value(ss) == "x10");

	std::cout << "-- Testing throwing at invalid params" << std::endl;
	try {
		m.assign("x","a{");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }

	try {
		m.assign("x","a}");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }
	
	try {
		m.assign("x","a{0}");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }

	if(throws) {
		try {
			m.map(ss,"undefined");
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
		
		try {
			m.map(ss,"undefined");
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
		
		try {
			m.map(ss,"test1",1,2);
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
	}
	else {

		m.map(ss,"undefined");
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");

		m.map(ss,"undefined");
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");

		m.map(ss,"test1",1,2);
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");
	}
}